

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O0

Abc_Ntk_t * Io_ReadNetlist(char *pFileName,Io_FileType_t FileType,int fCheck)

{
  bool bVar1;
  Io_FileType_t IVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pModel;
  int fCycle;
  int i;
  Abc_Ntk_t *pNtk;
  FILE *pFile;
  int fCheck_local;
  Io_FileType_t FileType_local;
  char *pFileName_local;
  
  if ((FileType == IO_FILE_NONE) || (FileType == IO_FILE_UNKNOWN)) {
    fprintf(_stdout,"Generic file reader requires a known file extension to open \"%s\".\n",
            pFileName);
    pFileName_local = (char *)0x0;
  }
  else {
    __stream = fopen(pFileName,"r");
    if (__stream == (FILE *)0x0) {
      fprintf(_stdout,"Cannot open input file \"%s\". ",pFileName);
      pcVar4 = Extra_FileGetSimilarName(pFileName,".blif",".bench",".pla",".baf",".aig");
      if (pcVar4 != (char *)0x0) {
        fprintf(_stdout,"Did you mean \"%s\"?",pcVar4);
      }
      fprintf(_stdout,"\n");
      pFileName_local = (char *)0x0;
    }
    else {
      fclose(__stream);
      if (((FileType == IO_FILE_AIGER) || (FileType == IO_FILE_BAF)) || (FileType == IO_FILE_BBLIF))
      {
        if (FileType == IO_FILE_AIGER) {
          _fCycle = Io_ReadAiger(pFileName,fCheck);
        }
        else if (FileType == IO_FILE_BAF) {
          _fCycle = Io_ReadBaf(pFileName,fCheck);
        }
        else {
          _fCycle = Io_ReadBblif(pFileName,fCheck);
        }
        if (_fCycle == (Abc_Ntk_t *)0x0) {
          fprintf(_stdout,"Reading AIG from file has failed.\n");
          pFileName_local = (char *)0x0;
        }
        else {
          pFileName_local = (char *)_fCycle;
        }
      }
      else {
        if (FileType == IO_FILE_BLIF) {
          _fCycle = Io_ReadBlifMv(pFileName,0,fCheck);
        }
        else {
          IVar2 = Io_ReadFileType(pFileName);
          if (IVar2 == IO_FILE_BLIFMV) {
            _fCycle = Io_ReadBlifMv(pFileName,1,fCheck);
          }
          else if (FileType == IO_FILE_BENCH) {
            _fCycle = Io_ReadBench(pFileName,fCheck);
          }
          else if (FileType == IO_FILE_EDIF) {
            _fCycle = Io_ReadEdif(pFileName,fCheck);
          }
          else if (FileType == IO_FILE_EQN) {
            _fCycle = Io_ReadEqn(pFileName,fCheck);
          }
          else if (FileType == IO_FILE_PLA) {
            _fCycle = Io_ReadPla(pFileName,0,0,0,0,fCheck);
          }
          else {
            if (FileType != IO_FILE_VERILOG) {
              fprintf(_stderr,"Unknown file format.\n");
              return (Abc_Ntk_t *)0x0;
            }
            _fCycle = Io_ReadVerilog(pFileName,fCheck);
          }
        }
        if (_fCycle == (Abc_Ntk_t *)0x0) {
          fprintf(_stdout,"Reading network from file has failed.\n");
          pFileName_local = (char *)0x0;
        }
        else {
          if ((fCheck != 0) &&
             ((iVar3 = Abc_NtkBlackboxNum(_fCycle), iVar3 != 0 ||
              (iVar3 = Abc_NtkWhiteboxNum(_fCycle), iVar3 != 0)))) {
            bVar1 = false;
            for (pModel._4_4_ = 0; iVar3 = Vec_PtrSize(_fCycle->pDesign->vModules),
                pModel._4_4_ < iVar3; pModel._4_4_ = pModel._4_4_ + 1) {
              pNtk_00 = (Abc_Ntk_t *)Vec_PtrEntry(_fCycle->pDesign->vModules,pModel._4_4_);
              iVar3 = Abc_NtkIsAcyclicWithBoxes(pNtk_00);
              if (iVar3 == 0) {
                bVar1 = true;
              }
            }
            if (bVar1) {
              Abc_NtkDelete(_fCycle);
              return (Abc_Ntk_t *)0x0;
            }
          }
          pFileName_local = (char *)_fCycle;
        }
      }
    }
  }
  return (Abc_Ntk_t *)pFileName_local;
}

Assistant:

Abc_Ntk_t * Io_ReadNetlist( char * pFileName, Io_FileType_t FileType, int fCheck )
{
    FILE * pFile;
    Abc_Ntk_t * pNtk;
    if ( FileType == IO_FILE_NONE || FileType == IO_FILE_UNKNOWN )
    {
        fprintf( stdout, "Generic file reader requires a known file extension to open \"%s\".\n", pFileName );
        return NULL;
    }
    // check if the file exists
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Cannot open input file \"%s\". ", pFileName );
        if ( (pFileName = Extra_FileGetSimilarName( pFileName, ".blif", ".bench", ".pla", ".baf", ".aig" )) )
            fprintf( stdout, "Did you mean \"%s\"?", pFileName );
        fprintf( stdout, "\n" );
       return NULL;
    }
    fclose( pFile );
    // read the AIG
    if ( FileType == IO_FILE_AIGER || FileType == IO_FILE_BAF || FileType == IO_FILE_BBLIF )
    {
        if ( FileType == IO_FILE_AIGER )
            pNtk = Io_ReadAiger( pFileName, fCheck );
        else if ( FileType == IO_FILE_BAF )
            pNtk = Io_ReadBaf( pFileName, fCheck );
        else // if ( FileType == IO_FILE_BBLIF )
            pNtk = Io_ReadBblif( pFileName, fCheck );
        if ( pNtk == NULL )
        {
            fprintf( stdout, "Reading AIG from file has failed.\n" );
            return NULL;
        }
        return pNtk;
    }
    // read the new netlist
    if ( FileType == IO_FILE_BLIF )
//        pNtk = Io_ReadBlif( pFileName, fCheck );
        pNtk = Io_ReadBlifMv( pFileName, 0, fCheck );
    else if ( Io_ReadFileType(pFileName) == IO_FILE_BLIFMV )
        pNtk = Io_ReadBlifMv( pFileName, 1, fCheck );
    else if ( FileType == IO_FILE_BENCH )
        pNtk = Io_ReadBench( pFileName, fCheck );
    else if ( FileType == IO_FILE_EDIF )
        pNtk = Io_ReadEdif( pFileName, fCheck );
    else if ( FileType == IO_FILE_EQN )
        pNtk = Io_ReadEqn( pFileName, fCheck );
    else if ( FileType == IO_FILE_PLA )
        pNtk = Io_ReadPla( pFileName, 0, 0, 0, 0, fCheck );
    else if ( FileType == IO_FILE_VERILOG )
        pNtk = Io_ReadVerilog( pFileName, fCheck );
    else 
    {
        fprintf( stderr, "Unknown file format.\n" );
        return NULL;
    }
    if ( pNtk == NULL )
    {
        fprintf( stdout, "Reading network from file has failed.\n" );
        return NULL;
    }
    if ( fCheck && (Abc_NtkBlackboxNum(pNtk) || Abc_NtkWhiteboxNum(pNtk)) )
    {
        int i, fCycle = 0;
        Abc_Ntk_t * pModel;
//        fprintf( stdout, "Warning: The network contains hierarchy.\n" );
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pModel, i )
                if ( !Abc_NtkIsAcyclicWithBoxes( pModel ) )
                    fCycle = 1;
        if ( fCycle )
        {
            Abc_NtkDelete( pNtk );
            return NULL;    
        }
    }
    return pNtk;
}